

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O0

string * __thiscall
bandit::reporter::progress_base::current_context_name_abi_cxx11_
          (string *__return_storage_ptr__,progress_base *this)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  progress_base *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->contexts_);
  context = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->contexts_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&context), bVar1) {
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar2);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string current_context_name() {
        std::string name;

        for (const auto& context : contexts_) {
          if (name.size() > 0) {
            name += " ";
          }

          name += context;
        }

        return name;
      }